

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigSudokuVisualizer.cpp
# Opt level: O1

string * __thiscall
BigSudokuVisualizer::createBorderRightStyle_abi_cxx11_
          (string *__return_storage_ptr__,BigSudokuVisualizer *this,SudokuGitter *gitter)

{
  uint uVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  uint __val;
  string __str;
  char *local_58;
  uint local_50;
  char local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  uVar1 = gitter->elements;
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  __val = gitter->quadWidth - 1;
  do {
    if (uVar1 * uVar1 <= __val) {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    cVar3 = '\x01';
    if (9 < __val) {
      uVar5 = (ulong)__val;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        uVar4 = (uint)uVar5;
        if (uVar4 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_00105839;
        }
        if (uVar4 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_00105839;
        }
        if (uVar4 < 10000) goto LAB_00105839;
        uVar5 = uVar5 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (99999 < uVar4);
      cVar3 = cVar3 + '\x01';
    }
LAB_00105839:
    local_58 = local_48;
    std::__cxx11::string::_M_construct((ulong)&local_58,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_58,local_50,__val);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58);
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    __val = __val + gitter->quadWidth;
  } while( true );
}

Assistant:

const std::string BigSudokuVisualizer::createBorderRightStyle(SudokuGitter gitter) {
    unsigned int size = gitter.getElements();
    unsigned int elements = size * size;
    std::string border_right = "";
    for (unsigned int i = gitter.getQuadWidth() - 1; i < elements; i += gitter.getQuadWidth()) {
        border_right.append("#bigCell-");
        border_right.append(std::to_string(i));
        border_right.append(", ");
    }
    border_right = border_right.substr(0, border_right.length() - 2);
    border_right.append(" { border-right: 2px solid #000; } ");
    return border_right;
}